

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

void __thiscall Image::Blit(Image *this,Image *src,int x,int y)

{
  color_t cVar1;
  int iVar2;
  int iVar3;
  color_t local_2b;
  int local_28;
  int local_24;
  int xx;
  int yy;
  int y_local;
  int x_local;
  Image *src_local;
  Image *this_local;
  
  local_24 = 0;
  xx = y;
  yy = x;
  _y_local = src;
  src_local = this;
  while( true ) {
    iVar3 = local_24;
    iVar2 = GetHeight(_y_local);
    if (iVar2 <= iVar3) break;
    local_28 = 0;
    while( true ) {
      iVar3 = local_28;
      iVar2 = GetWidth(_y_local);
      if (iVar2 <= iVar3) break;
      iVar3 = local_28 + yy;
      iVar2 = local_24 + xx;
      cVar1 = Get(_y_local,local_28,local_24);
      local_2b._0_2_ = cVar1._0_2_;
      local_2b.b = cVar1.b;
      Set(this,iVar3,iVar2,&local_2b);
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void Image::Blit(Image const& src, int x, int y) {
  for (auto yy = 0; yy < src.GetHeight(); ++yy) {
    for (auto xx = 0; xx < src.GetWidth(); ++xx) {
      Set(xx + x, yy + y, src.Get(xx, yy));
    }
  }
}